

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

class_<PairedReadsMapper> * __thiscall
pybind11::class_<PairedReadsMapper>::
def_property_static<pybind11::is_method,pybind11::return_value_policy>
          (class_<PairedReadsMapper> *this,char *name,cpp_function *fget,cpp_function *fset,
          is_method *extra,return_value_policy *extra_1)

{
  function_record *rec_func;
  function_record *pfVar1;
  
  rec_func = get_function_record((fget->super_function).super_object.super_handle.m_ptr);
  pfVar1 = get_function_record((fset->super_function).super_object.super_handle.m_ptr);
  if (rec_func != (function_record *)0x0) {
    rec_func->field_0x59 = rec_func->field_0x59 | 0x10;
    (rec_func->scope).m_ptr = (extra->class_).m_ptr;
    rec_func->policy = *extra_1;
  }
  if (pfVar1 != (function_record *)0x0) {
    pfVar1->field_0x59 = pfVar1->field_0x59 | 0x10;
    (pfVar1->scope).m_ptr = (extra->class_).m_ptr;
    pfVar1->policy = *extra_1;
    if (rec_func == (function_record *)0x0) {
      rec_func = pfVar1;
    }
  }
  detail::generic_type::def_property_static_impl
            (&this->super_generic_type,name,(fget->super_function).super_object.super_handle.m_ptr,
             (fset->super_function).super_object.super_handle.m_ptr,rec_func);
  return this;
}

Assistant:

class_ &def_property_static(const char *name, const cpp_function &fget, const cpp_function &fset, const Extra& ...extra) {
        static_assert( 0 == detail::constexpr_sum(std::is_base_of<arg, Extra>::value...),
                      "Argument annotations are not allowed for properties");
        auto rec_fget = get_function_record(fget), rec_fset = get_function_record(fset);
        auto *rec_active = rec_fget;
        if (rec_fget) {
           char *doc_prev = rec_fget->doc; /* 'extra' field may include a property-specific documentation string */
           detail::process_attributes<Extra...>::init(extra..., rec_fget);
           if (rec_fget->doc && rec_fget->doc != doc_prev) {
              free(doc_prev);
              rec_fget->doc = strdup(rec_fget->doc);
           }
        }
        if (rec_fset) {
            char *doc_prev = rec_fset->doc;
            detail::process_attributes<Extra...>::init(extra..., rec_fset);
            if (rec_fset->doc && rec_fset->doc != doc_prev) {
                free(doc_prev);
                rec_fset->doc = strdup(rec_fset->doc);
            }
            if (! rec_active) rec_active = rec_fset;
        }
        def_property_static_impl(name, fget, fset, rec_active);
        return *this;
    }